

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O1

void __thiscall bssl::CERT::~CERT(CERT *this)

{
  (*this->x509_method->cert_free)(this);
  (this->sid_ctx).size_ = '\0';
  std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr(&this->legacy_credential)
  ;
  Vector<std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>_>::clear(&this->credentials);
  return;
}

Assistant:

UniquePtr<CERT> ssl_cert_dup(CERT *cert) {
  UniquePtr<CERT> ret = MakeUnique<CERT>(cert->x509_method);
  if (!ret) {
    return nullptr;
  }

  // TODO(crbug.com/boringssl/431): This should just be |CopyFrom|.
  for (const auto &cred : cert->credentials) {
    if (!ret->credentials.Push(UpRef(cred))) {
      return nullptr;
    }
  }

  // |legacy_credential| is mutable, so it must be copied. We cannot simply
  // bump the reference count.
  ret->legacy_credential = cert->legacy_credential->Dup();
  if (ret->legacy_credential == nullptr) {
    return nullptr;
  }

  ret->cert_cb = cert->cert_cb;
  ret->cert_cb_arg = cert->cert_cb_arg;

  ret->x509_method->cert_dup(ret.get(), cert);

  ret->sid_ctx = cert->sid_ctx;
  return ret;
}